

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

bool __thiscall capnp::DynamicStruct::Builder::has(Builder *this,StringPtr name,HasMode mode)

{
  Field field;
  bool bVar1;
  Reader local_90;
  Field local_58;
  
  StructSchema::getFieldByName(&local_58,&this->schema,name);
  asReader(&local_90,this);
  field.index = local_58.index;
  field._12_4_ = local_58._12_4_;
  field.parent.super_Schema.raw = local_58.parent.super_Schema.raw;
  field.proto._reader.segment = local_58.proto._reader.segment;
  field.proto._reader.capTable = local_58.proto._reader.capTable;
  field.proto._reader.data = local_58.proto._reader.data;
  field.proto._reader.pointers = local_58.proto._reader.pointers;
  field.proto._reader.dataSize = local_58.proto._reader.dataSize;
  field.proto._reader.pointerCount = local_58.proto._reader.pointerCount;
  field.proto._reader._38_2_ = local_58.proto._reader._38_2_;
  field.proto._reader.nestingLimit = local_58.proto._reader.nestingLimit;
  field.proto._reader._44_4_ = local_58.proto._reader._44_4_;
  bVar1 = DynamicStruct::Reader::has(&local_90,field,mode);
  return bVar1;
}

Assistant:

bool DynamicStruct::Builder::has(kj::StringPtr name, HasMode mode) {
  return has(schema.getFieldByName(name), mode);
}